

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O2

void __thiscall vkt::ssbo::ShaderInterface::~ShaderInterface(ShaderInterface *this)

{
  StructType *this_00;
  BufferBlock *this_01;
  pointer ppSVar1;
  pointer ppBVar2;
  
  for (ppSVar1 = (this->m_structs).
                 super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppSVar1 !=
      (this->m_structs).super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppSVar1 = ppSVar1 + 1) {
    this_00 = *ppSVar1;
    if (this_00 != (StructType *)0x0) {
      glu::StructType::~StructType(this_00);
    }
    operator_delete(this_00,0x38);
  }
  for (ppBVar2 = (this->m_bufferBlocks).
                 super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppBVar2 !=
      (this->m_bufferBlocks).
      super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppBVar2 = ppBVar2 + 1) {
    this_01 = *ppBVar2;
    if (this_01 != (BufferBlock *)0x0) {
      BufferBlock::~BufferBlock(this_01);
    }
    operator_delete(this_01,0x80);
  }
  std::_Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>::
  ~_Vector_base(&(this->m_bufferBlocks).
                 super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
               );
  std::_Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>::~_Vector_base
            ((_Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_> *)this);
  return;
}

Assistant:

ShaderInterface::~ShaderInterface (void)
{
	for (std::vector<StructType*>::iterator i = m_structs.begin(); i != m_structs.end(); i++)
		delete *i;

	for (std::vector<BufferBlock*>::iterator i = m_bufferBlocks.begin(); i != m_bufferBlocks.end(); i++)
		delete *i;
}